

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixStep1
               (double *f0_base,int f0_length,double allowed_range,double *f0_step1)

{
  double dVar1;
  double local_40;
  int i_1;
  double reference_f0;
  int i;
  double *f0_step1_local;
  double allowed_range_local;
  int f0_length_local;
  double *f0_base_local;
  
  for (i = 0; i < f0_length; i = i + 1) {
    f0_step1[i] = 0.0;
  }
  for (i_1 = 2; i_1 < f0_length; i_1 = i_1 + 1) {
    if ((f0_base[i_1] != 0.0) || (NAN(f0_base[i_1]))) {
      dVar1 = f0_base[i_1 + -1] + f0_base[i_1 + -1] + -f0_base[i_1 + -2];
      if ((ABS((f0_base[i_1] - dVar1) / dVar1) <= allowed_range) ||
         (ABS(f0_base[i_1] - f0_base[i_1 + -1]) / f0_base[i_1 + -1] <= allowed_range)) {
        local_40 = f0_base[i_1];
      }
      else {
        local_40 = 0.0;
      }
      f0_step1[i_1] = local_40;
    }
  }
  return;
}

Assistant:

static void FixStep1(const double *f0_base, int f0_length,
    double allowed_range, double *f0_step1) {
  for (int i = 0; i < f0_length; ++i) f0_step1[i] = 0.0;
  double reference_f0;
  for (int i = 2; i < f0_length; ++i) {
    if (f0_base[i] == 0.0) continue;
    reference_f0 = f0_base[i - 1] * 2 - f0_base[i - 2];
    f0_step1[i] =
      fabs((f0_base[i] - reference_f0) / reference_f0) > allowed_range &&
      fabs((f0_base[i] - f0_base[i - 1])) / f0_base[i - 1] > allowed_range ?
      0.0 : f0_base[i];
  }
}